

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_from_memory
                    (nk_font_atlas *atlas,void *memory,nk_size size,float height,
                    nk_font_config *config)

{
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  nk_font_config cfg;
  undefined1 local_e0 [20];
  float in_stack_ffffffffffffff34;
  nk_font_config *in_stack_ffffffffffffff40;
  nk_font_atlas *in_stack_ffffffffffffff48;
  undefined1 local_88 [8];
  long local_80;
  long local_78;
  undefined1 local_70;
  undefined4 local_68;
  undefined4 local_24;
  long local_20;
  long local_18;
  nk_font *local_8;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x30) == 0)) || (*(long *)(in_RDI + 0x38) == 0)) ||
     (((in_RSI == 0 || (in_RDX == 0)) ||
      ((*(long *)(in_RDI + 0x18) == 0 || (*(long *)(in_RDI + 0x20) == 0)))))) {
    local_8 = (nk_font *)0x0;
  }
  else {
    local_24 = in_XMM0_Da;
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (in_RCX == (void *)0x0) {
      nk_font_config(in_stack_ffffffffffffff34);
      memcpy(local_88,local_e0,0x58);
    }
    else {
      memcpy(local_88,in_RCX,0x58);
    }
    local_80 = local_18;
    local_78 = local_20;
    local_68 = local_24;
    local_70 = 0;
    local_8 = nk_font_atlas_add(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  return local_8;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_memory(struct nk_font_atlas *atlas, void *memory,
nk_size size, float height, const struct nk_font_config *config)
{
struct nk_font_config cfg;
NK_ASSERT(memory);
NK_ASSERT(size);

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);
if (!atlas || !atlas->temporary.alloc || !atlas->temporary.free || !memory || !size ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = memory;
cfg.ttf_size = size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 0;
return nk_font_atlas_add(atlas, &cfg);
}